

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QDBusUnixFileDescriptor>::relocate
          (QArrayDataPointer<QDBusUnixFileDescriptor> *this,qsizetype offset,
          QDBusUnixFileDescriptor **data)

{
  QDBusUnixFileDescriptor *d_first;
  QDBusUnixFileDescriptor *pQVar1;
  
  d_first = this->ptr + offset * 8;
  QtPrivate::q_relocate_overlap_n<QDBusUnixFileDescriptor,long_long>(this->ptr,this->size,d_first);
  if (data != (QDBusUnixFileDescriptor **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size * 8)) {
      *data = pQVar1 + offset * 8;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }